

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O0

int checkerBig1(void)

{
  int iVar1;
  FILE *__stream;
  int local_2754;
  int local_2750;
  int d;
  int v2;
  int v1;
  int p [2501];
  char *local_28;
  char *message;
  int i;
  FILE *out;
  
  __stream = fopen("out.txt","r");
  local_28 = "PASSED";
  d = 1;
  local_2750 = 1;
  if (__stream == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    out._4_4_ = 0xffffffff;
  }
  else {
    message._4_4_ = 0;
    while( true ) {
      if ((4999 < message._4_4_) ||
         (local_28 = ScanInt((FILE *)__stream,&local_2754), local_28 != "PASSED"))
      goto LAB_00103a9e;
      if (((message._4_4_ < 0x9c5) && (local_2754 != message._4_4_)) ||
         ((0x9c4 < message._4_4_ && (local_2754 != 5000 - message._4_4_)))) break;
      message._4_4_ = message._4_4_ + 1;
    }
    printf("wrong output -- ");
    local_28 = "FAILED";
LAB_00103a9e:
    if (local_28 == "PASSED") {
      message._4_4_ = 0;
      while ((message._4_4_ < 0x9c5 &&
             (local_28 = ScanInt((FILE *)__stream,&v2 + message._4_4_), local_28 == "PASSED"))) {
        message._4_4_ = message._4_4_ + 1;
      }
      for (message._4_4_ = 0; message._4_4_ < 0x9c5; message._4_4_ = message._4_4_ + 1) {
        if ((&v2)[message._4_4_] != 0x9c5 - message._4_4_) {
          d = 0;
          break;
        }
      }
      for (message._4_4_ = 0; message._4_4_ < 0x9c4; message._4_4_ = message._4_4_ + 1) {
        if ((&v2)[message._4_4_] != message._4_4_ + 0x9c5) {
          local_2750 = 0;
          break;
        }
      }
      if (p[0x9c2] != 1) {
        local_2750 = 0;
      }
      if ((d == 0) && (local_2750 == 0)) {
        printf("wrong output -- ");
        local_28 = "FAILED";
      }
    }
    if ((local_28 == "PASSED") && (iVar1 = HaveGarbageAtTheEnd((FILE *)__stream), iVar1 != 0)) {
      local_28 = "FAILED";
    }
    fclose(__stream);
    printf("%s\n",local_28);
    out._4_4_ = (uint)(local_28 == "FAILED");
  }
  testN = testN + 1;
  return out._4_4_;
}

Assistant:

static int checkerBig1(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i;
    const char* message = Pass;
    int p[2501], v1 = 1, v2 = 1; // two shortest paths exist
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 5000; i++) {
        int d;
        message = ScanInt(out, &d);
        if (message != Pass) {
            break;
        }
        if ((i <= 2500 && d != i) || (i > 2500 && d != 5000-i)) {
            printf("wrong output -- ");
            message = Fail;
            break;
        }
    }
    if (message == Pass) {
        for (i = 0; i < 2501; i++) {
            message = ScanInt(out, &p[i]);
            if (message != Pass) {
                break;
            }
        }
        for (i = 0; i < 2501; i++)
            if (p[i] != 2501-i) { // 2501 2500 2499 ... 1
                v1 = 0;
                break;
            }
        for (i = 0; i < 2500; i++)
            if (p[i] != 2501+i) { // 2501 2502 ... 4999 5000 1
                v2 = 0;
                break;
            }
        if (p[2500] != 1) {
            v2 = 0;
        }
        if (v1 == 0 && v2 == 0) {
            printf("wrong output -- ");
            message = Fail;
        }
    }
    if (message == Pass && HaveGarbageAtTheEnd(out)) {
        message = Fail;
    }
    fclose(out);
    printf("%s\n", message);
    testN++;
    return message == Fail;
}